

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringAlgorithm.cpp
# Opt level: O0

CppWebSpider * __thiscall CppWebSpider::strip(CppWebSpider *this,string *target,string *s)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  undefined8 local_58;
  size_t j_1;
  size_t end;
  size_t j;
  size_t i;
  size_t start;
  size_t m;
  size_t n;
  string *s_local;
  string *target_local;
  string *ans;
  
  uVar2 = std::__cxx11::string::size();
  j_1 = std::__cxx11::string::size();
  if (j_1 < uVar2) {
    std::__cxx11::string::string((string *)this,(string *)target);
  }
  else {
    i = 0;
    while (i < j_1) {
      j = i;
      for (end = 0; end < uVar2; end = end + 1) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
        cVar1 = *pcVar3;
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)target);
        if (cVar1 != *pcVar3) break;
        j = j + 1;
      }
      if ((j == i) || (j % uVar2 != 0)) break;
      i = j;
    }
    j = j_1 - uVar2;
    while (i < j) {
      for (local_58 = 0; local_58 < uVar2; local_58 = local_58 + 1) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
        cVar1 = *pcVar3;
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)target);
        if (cVar1 != *pcVar3) break;
        j = j + 1;
      }
      if (j != j_1) break;
      j_1 = j_1 - uVar2;
      j = j_1 - uVar2;
    }
    std::__cxx11::string::substr((ulong)this,(ulong)target);
  }
  return this;
}

Assistant:

std::string strip(std::string target,std::string s){
		size_t n=s.size(),m=target.size();
		if(m<n)
			return target;
		size_t start=0,i=0;
		while(i<m){
			for(size_t j=0;j<n;j++){
				if(s[j]!=target[i])
					break;
				i++;
			}
			if(i==start)
				break;
			if(i%n==0)
				start=i;
			else
				break;
		}
		size_t end=m;
		i=end-n;
		while(i>start){
			for(size_t j=0;j<n;j++){
				if(s[j]!=target[i])
					break;
				i++;
			}
			if(i==end)
				end-=n;
			else
				break;
			i=end-n;
		}
		std::string ans=target.substr(start,end-start);
		return ans;
	}